

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect_p.h
# Opt level: O2

void __thiscall QGraphicsEffectPrivate::QGraphicsEffectPrivate(QGraphicsEffectPrivate *this)

{
  QObjectPrivate::QObjectPrivate(&this->super_QObjectPrivate,QObjectPrivateVersion);
  *(undefined ***)this = &PTR__QGraphicsEffectPrivate_007c5b60;
  this->source = (QGraphicsEffectSource *)0x0;
  (this->boundingRect).xp = 0.0;
  (this->boundingRect).h = 0.0;
  (this->boundingRect).yp = 0.0;
  (this->boundingRect).w = 0.0;
  this->field_0xa0 = this->field_0xa0 | 1;
  return;
}

Assistant:

inline void setGraphicsEffectSource(QGraphicsEffectSource *newSource)
    {
        QGraphicsEffect::ChangeFlags flags;
        if (source) {
            flags |= QGraphicsEffect::SourceDetached;
            source->d_func()->effectBoundingRectChanged();
            source->d_func()->invalidateCache();
            source->d_func()->detach();
            delete source;
        }
        source = newSource;
        if (newSource)
            flags |= QGraphicsEffect::SourceAttached;
        q_func()->sourceChanged(flags);
    }